

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_context.cpp
# Opt level: O2

void __thiscall jessilib::impl::timer_context::cancel(timer_context *this)

{
  shared_mutex *__rwlock;
  element_type *peVar1;
  bool bVar2;
  timer_context *in_RAX;
  timer_manager *ptVar3;
  timer *ptVar4;
  timer_context *local_38;
  
  local_38 = in_RAX;
  ptVar3 = timer_manager::instance();
  ptVar4 = timer_manager::thread_callback_timer();
  peVar1 = (ptVar4->m_context).
           super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == this) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_mutex);
  }
  std::mutex::lock(&ptVar3->m_mutex);
  __rwlock = &this->m_mutex;
  std::__shared_mutex_pthread::lock(&__rwlock->_M_impl);
  if ((this->m_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_38 = this;
    std::
    _Rb_tree<jessilib::impl::timer_context_*,_jessilib::impl::timer_context_*,_std::_Identity<jessilib::impl::timer_context_*>,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
    ::erase(&(ptVar3->m_active_timers)._M_t,&local_38);
    std::function<void_(jessilib::timer_&)>::operator=(&this->m_callback,(nullptr_t)0x0);
    bVar2 = detached(this);
    if (bVar2) {
      std::mutex::lock(&ptVar3->m_detached_timers_mutex);
      std::__cxx11::
      list<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
      ::erase(&ptVar3->m_detached_timers,(this->m_self)._M_node);
      pthread_mutex_unlock((pthread_mutex_t *)&ptVar3->m_detached_timers_mutex);
    }
  }
  ptVar3->is_timeout = false;
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  pthread_mutex_unlock((pthread_mutex_t *)&ptVar3->m_mutex);
  if (peVar1 == this) {
    std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  }
  std::condition_variable::notify_one();
  return;
}

Assistant:

void timer_context::cancel() {
	impl::timer_manager& manager = impl::timer_manager::instance();

	// Unlock mutex if it's currently being held by this thread
	bool needs_shared_lock = false;
	if (manager.thread_callback_timer().m_context.get() == this) {
		needs_shared_lock = true;
		m_mutex.unlock_shared();
	}

	{
		std::lock_guard<std::mutex> manager_guard(manager.m_mutex);
		std::lock_guard<std::shared_mutex> context_guard(m_mutex);

		if (!null()) {
			// Remove from active timers
			manager.m_active_timers.erase(this);

			// Nullify timer
			m_callback = nullptr;

			// Remove from detached timers (if it's detached)
			if (detached()) {
				std::lock_guard<std::mutex> detached_timers_lock(manager.m_detached_timers_mutex);
				manager.m_detached_timers.erase(m_self);
			}
		}

		manager.is_timeout = false;
	}

	// Re-lock mutex
	if (needs_shared_lock) {
		m_mutex.lock_shared();
	}

	manager.m_cvar.notify_one();
}